

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O3

void deltrap(level *lev,trap *trap)

{
  trap *ptVar1;
  trap *ptVar2;
  trap *ptVar3;
  
  ptVar1 = lev->lev_traps;
  if (ptVar1 == trap) {
    ptVar3 = (trap *)&lev->lev_traps;
    ptVar2 = ptVar1;
  }
  else {
    do {
      ptVar3 = ptVar1;
      ptVar2 = trap;
      ptVar1 = ptVar3->ntrap;
    } while (ptVar3->ntrap != trap);
  }
  ptVar3->ntrap = ptVar2->ntrap;
  free(trap);
  return;
}

Assistant:

void deltrap(struct level *lev, struct trap *trap)
{
	struct trap *ttmp;

	if (trap == lev->lev_traps)
		lev->lev_traps = lev->lev_traps->ntrap;
	else {
		for (ttmp = lev->lev_traps; ttmp->ntrap != trap; ttmp = ttmp->ntrap) ;
		ttmp->ntrap = trap->ntrap;
	}
	dealloc_trap(trap);
}